

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServer.cxx
# Opt level: O1

void __thiscall
cmDebugServer::cmDebugServer(cmDebugServer *this,cmDebugger *debugger,cmConnection *conn)

{
  cmServerBase::cmServerBase(&this->super_cmServerBase,conn);
  cmDebuggerListener::cmDebuggerListener(&this->super_cmDebuggerListener,debugger);
  (this->super_cmServerBase)._vptr_cmServerBase = (_func_int **)&PTR__cmDebugServer_00693ed8;
  (this->super_cmDebuggerListener)._vptr_cmDebuggerListener =
       (_func_int **)&PTR__cmDebugServer_00693f40;
  auto_handle_base_<uv_async_s>::auto_handle_base_
            ((auto_handle_base_<uv_async_s> *)&this->BroadcastQueueSignal);
  (this->BroadcastQueueSignal).super_auto_handle_<uv_async_s>.super_auto_handle_base_<uv_async_s>.
  _vptr_auto_handle_base_ = (_func_int **)&PTR_allocate_00692f80;
  (this->BroadcastQueueSignal).handleMutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->BroadcastQueueSignal).handleMutex.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)
   ((long)&(this->BroadcastQueueSignal).handleMutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->BroadcastQueueSignal).handleMutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->BroadcastQueueSignal).handleMutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->BroadcastQueueMutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->BroadcastQueueMutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->BroadcastQueueMutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->BroadcastQueueMutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->BroadcastQueueMutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->BroadcastQueue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->BroadcastQueue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->BroadcastQueue).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

cmDebugServer::cmDebugServer(cmDebugger& debugger, cmConnection* conn)
  : cmServerBase(conn)
  , cmDebuggerListener(debugger)
{
}